

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_url_value(char **begin,char *end,string_t *id)

{
  _Bool _Var1;
  bool bVar2;
  string_t *local_30;
  char *it;
  string_t *id_local;
  char *end_local;
  char **begin_local;
  
  local_30 = (string_t *)*begin;
  it = (char *)id;
  id_local = (string_t *)end;
  end_local = (char *)begin;
  _Var1 = skip_string((char **)&local_30,end,"url");
  if ((((_Var1) && (_Var1 = skip_ws((char **)&local_30,(char *)id_local), _Var1)) &&
      (_Var1 = skip_delim((char **)&local_30,(char *)id_local,'('), _Var1)) &&
     (_Var1 = skip_ws((char **)&local_30,(char *)id_local), _Var1)) {
    _Var1 = skip_delim((char **)&local_30,(char *)id_local,'#');
    if (_Var1) {
      *(string_t **)it = local_30;
      it[8] = '\0';
      it[9] = '\0';
      it[10] = '\0';
      it[0xb] = '\0';
      it[0xc] = '\0';
      it[0xd] = '\0';
      it[0xe] = '\0';
      it[0xf] = '\0';
      while( true ) {
        bVar2 = false;
        if (local_30 < id_local) {
          bVar2 = *(char *)&local_30->data != ')';
        }
        if (!bVar2) break;
        *(long *)(it + 8) = *(long *)(it + 8) + 1;
        local_30 = (string_t *)((long)&local_30->data + 1);
      }
      _Var1 = skip_delim((char **)&local_30,(char *)id_local,')');
      if (_Var1) {
        *(string_t **)end_local = local_30;
        skip_ws((char **)end_local,(char *)id_local);
        begin_local._7_1_ = true;
      }
      else {
        begin_local._7_1_ = false;
      }
    }
    else {
      begin_local._7_1_ = false;
    }
  }
  else {
    begin_local._7_1_ = false;
  }
  return begin_local._7_1_;
}

Assistant:

static bool parse_url_value(const char** begin, const char* end, string_t* id)
{
    const char* it = *begin;
    if(!skip_string(&it, end, "url")
        || !skip_ws(&it, end)
        || !skip_delim(&it, end, '(')
        || !skip_ws(&it, end)) {
        return false;
    }

    if(!skip_delim(&it, end, '#'))
        return false;
    id->data = it;
    id->length = 0;
    while(it < end && *it != ')') {
        ++id->length;
        ++it;
    }

    if(!skip_delim(&it, end, ')'))
        return false;
    *begin = it;
    skip_ws(begin, end);
    return true;
}